

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  size_t sVar6;
  Result RVar7;
  int iVar8;
  BinarySectionOrder BVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Enum EVar13;
  ulong uVar14;
  char *pcVar15;
  char *format;
  uint32_t magic;
  uint32_t value;
  bool seen_section_code [14];
  BinaryReader reader;
  byte local_159;
  size_t local_158;
  ulong local_150;
  undefined4 local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  char acStack_138 [16];
  BinaryReader local_128;
  
  local_128.state_.offset = 0;
  local_128.read_end_ = size;
  local_128.state_.data = (uint8_t *)data;
  local_128.state_.size = size;
  BinaryReaderLogging::BinaryReaderLogging
            (&local_128.logging_delegate_,options->log_stream,delegate);
  local_128.delegate_ = &local_128.logging_delegate_.super_BinaryReaderDelegate;
  if (options->log_stream == (Stream *)0x0) {
    local_128.delegate_ = delegate;
  }
  local_128.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.last_known_section_ = Invalid;
  local_128.did_read_names_section_ = false;
  local_128.reading_custom_section_ = false;
  local_128.num_func_imports_ = 0;
  local_128.num_table_imports_ = 0;
  local_128.num_memory_imports_ = 0;
  local_128.num_global_imports_ = 0;
  local_128.num_tag_imports_ = 0;
  local_128.num_function_signatures_ = 0;
  local_128.num_function_bodies_ = 0;
  local_128.data_count_ = 0xffffffff;
  local_128.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.options_ = options;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&local_128.state_);
  bVar1 = options->stop_on_first_error;
  local_140 = 0;
  RVar7 = anon_unknown_25::BinaryReader::ReadT<unsigned_int>
                    (&local_128,&local_140,"uint32_t","magic");
  EVar13 = Error;
  if (RVar7.enum_ != Error) {
    if (local_140 == 0x6d736100) {
      local_144 = 0;
      RVar7 = anon_unknown_25::BinaryReader::ReadT<unsigned_int>
                        (&local_128,&local_144,"uint32_t","version");
      EVar13 = Error;
      if (RVar7.enum_ != Error) {
        if (local_144 == 1) {
          iVar8 = (*(local_128.delegate_)->_vptr_BinaryReaderDelegate[4])(local_128.delegate_,1);
          if (iVar8 == 0) {
            acStack_138[8] = '\0';
            acStack_138[9] = '\0';
            acStack_138[10] = '\0';
            acStack_138[0xb] = '\0';
            acStack_138[0xc] = '\0';
            acStack_138[0xd] = '\0';
            acStack_138[0] = '\0';
            acStack_138[1] = '\0';
            acStack_138[2] = '\0';
            acStack_138[3] = '\0';
            acStack_138[4] = '\0';
            acStack_138[5] = '\0';
            acStack_138[6] = '\0';
            acStack_138[7] = '\0';
            if (local_128.state_.offset < local_128.state_.size) {
              uVar14 = 0;
              bVar4 = false;
              do {
                RVar7 = anon_unknown_25::BinaryReader::ReadU8(&local_128,&local_159,"section code");
                if (RVar7.enum_ == Error) {
LAB_001126a2:
                  bVar2 = true;
                  sVar6 = local_128.read_end_;
                }
                else {
                  RVar7 = anon_unknown_25::BinaryReader::ReadU32Leb128
                                    (&local_128,&local_13c,"section size");
                  sVar6 = local_128.read_end_;
                  bVar5 = local_159;
                  uVar11 = (ulong)local_13c;
                  if (RVar7.enum_ == Error) goto LAB_001126a2;
                  uVar10 = local_128.state_.offset + uVar11;
                  local_128.read_end_ = uVar10;
                  uVar12 = (ulong)local_159;
                  if (local_159 < 0xe) {
                    if (uVar12 != 0) {
                      if (acStack_138[uVar12] == '\x01') {
                        pcVar15 = GetSectionName((uint)local_159);
                        anon_unknown_25::BinaryReader::PrintError
                                  (&local_128,"multiple %s sections",pcVar15);
                        bVar2 = true;
                        goto LAB_0011281d;
                      }
                      acStack_138[uVar12] = '\x01';
                    }
                    local_158 = sVar6;
                    if (local_128.state_.size < uVar10) {
                      pcVar15 = "invalid section size: extends past end";
LAB_00112764:
                      anon_unknown_25::BinaryReader::PrintError(&local_128,pcVar15);
                    }
                    else {
                      if ((uVar12 == 0) || (local_128.last_known_section_ == Invalid)) {
LAB_001127a2:
                        if ((uVar12 == 0) || (local_128.did_read_names_section_ == false)) {
                          iVar8 = (*(local_128.delegate_)->_vptr_BinaryReaderDelegate[6])
                                            (local_128.delegate_,uVar14,uVar12,uVar11);
                          if (iVar8 == 0) {
                            local_148 = (undefined4)
                                        CONCAT71((int7)(uVar11 >> 8),
                                                 (local_128.options_)->stop_on_first_error);
                            local_150 = uVar12;
                            EVar13 = (*(code *)(&DAT_00125978 + *(int *)(&DAT_00125978 + uVar12 * 4)
                                               ))();
                            return (Result)EVar13;
                          }
                          pcVar15 = "BeginSection callback failed";
                          goto LAB_00112764;
                        }
                        pcVar15 = GetSectionName((uint)bVar5);
                        format = "%s section can not occur after Name section";
                      }
                      else {
                        BVar9 = GetSectionOrder((uint)local_159);
                        local_150 = CONCAT44(local_150._4_4_,BVar9);
                        BVar9 = GetSectionOrder(local_128.last_known_section_);
                        if ((int)BVar9 < (int)local_150) goto LAB_001127a2;
                        pcVar15 = GetSectionName((uint)bVar5);
                        format = "section %s out of order";
                      }
                      anon_unknown_25::BinaryReader::PrintError(&local_128,format,pcVar15);
                    }
                    bVar2 = true;
                    sVar6 = local_158;
                  }
                  else {
                    anon_unknown_25::BinaryReader::PrintError(&local_128,"invalid section code: %u")
                    ;
                    bVar2 = true;
                    if (bVar1 == false) {
                      local_128.state_.offset = local_128.read_end_;
                      bVar2 = false;
                      bVar4 = true;
                    }
                  }
                }
LAB_0011281d:
                local_128.read_end_ = sVar6;
                bVar3 = true;
              } while ((!bVar2) &&
                      (uVar14 = (ulong)((int)uVar14 + 1), bVar3 = bVar4,
                      local_128.state_.offset < local_128.state_.size));
              EVar13 = Error;
              if (bVar3) goto LAB_00112575;
            }
            if (local_128.num_function_signatures_ == local_128.num_function_bodies_) {
              iVar8 = (*(local_128.delegate_)->_vptr_BinaryReaderDelegate[5])();
              if (iVar8 == 0) {
                EVar13 = Ok;
                goto LAB_00112575;
              }
              pcVar15 = "EndModule callback failed";
            }
            else {
              pcVar15 = "function signature count != function body count";
            }
          }
          else {
            pcVar15 = "BeginModule callback failed";
          }
          anon_unknown_25::BinaryReader::PrintError(&local_128,pcVar15);
          EVar13 = Error;
        }
        else {
          anon_unknown_25::BinaryReader::PrintError
                    (&local_128,"bad wasm file version: %#x (expected %#x)",(ulong)local_144,1);
        }
      }
    }
    else {
      anon_unknown_25::BinaryReader::PrintError(&local_128,"bad magic value");
    }
  }
LAB_00112575:
  if (local_128.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.memories.
                    super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.memories.
                          super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.memories.
                          super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.target_depths_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.target_depths_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.target_depths_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.fields_.
                    super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.fields_.
                          super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.fields_.
                          super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.result_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.result_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.result_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.param_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.param_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.param_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (Result)EVar13;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule(
      BinaryReader::ReadModuleOptions{options.stop_on_first_error});
}